

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O1

void Gli_ManSetDataSaved(Gli_Man_t *p,int iBit)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      piVar3 = p->pObjData;
      if (piVar3 == (int *)0x0) break;
      bVar10 = (p->pSimInfoPrev[lVar5] >> (iBit & 0x1fU) & 1) != 0;
      piVar3[pVVar6->pArray[lVar5]] =
           (piVar3[pVVar6->pArray[lVar5]] & 0xfffffff9U) + (uint)bVar10 * 4 + (uint)bVar10 * 2;
      lVar5 = lVar5 + 1;
      pVVar6 = p->vCis;
    } while (lVar5 < pVVar6->nSize);
  }
  if (0 < p->nObjData) {
    uVar4 = 0;
    do {
      if (p->pObjData == (int *)0x0) {
        return;
      }
      puVar1 = (uint *)(p->pObjData + uVar4);
      uVar2 = *puVar1;
      if ((uVar2 & 1) == 0) {
        uVar9 = uVar2 >> 4 & 7;
        if (uVar9 == 0) {
          uVar8 = 0;
        }
        else {
          uVar7 = 0;
          uVar8 = 0;
          do {
            uVar8 = uVar8 | (puVar1[-(long)(int)puVar1[uVar7 + 7]] >> 1 & 1) << ((byte)uVar7 & 0x1f)
            ;
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
        bVar10 = (*(uint *)(*(long *)(puVar1 + 2) + (long)((int)uVar8 >> 5) * 4) >> (uVar8 & 0x1f) &
                 1) != 0;
        *puVar1 = (uVar2 & 0xfffffff8) + (uint)bVar10 * 4 + (uint)bVar10 * 2;
      }
      uVar4 = uVar4 + (*puVar1 >> 7) + (*puVar1 >> 4 & 7) + 8;
    } while ((int)uVar4 < p->nObjData);
  }
  return;
}

Assistant:

void Gli_ManSetDataSaved( Gli_Man_t * p, int iBit )
{
    Gli_Obj_t * pObj;
    int i;
    Gli_ManForEachCi( p, pObj, i )
        pObj->fPhase = pObj->fPhase2 = ((p->pSimInfoPrev[i] >> iBit) & 1);
    Gli_ManForEachNode( p, pObj, i )
        pObj->fPhase = pObj->fPhase2 = Gli_NodeComputeValue( pObj );
}